

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

string * __thiscall
pbrt::ToString_abi_cxx11_(string *__return_storage_ptr__,pbrt *this,CurveType type)

{
  allocator<char> *__a;
  int iVar1;
  char *__s;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  iVar1 = (int)this;
  if (iVar1 == 2) {
    __s = "Ribbon";
    __a = &local_b;
  }
  else if (iVar1 == 1) {
    __s = "Cylinder";
    __a = &local_a;
  }
  else {
    if (iVar1 != 0) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes.cpp"
               ,0x1bc,"Unhandled case");
    }
    __s = "Flat";
    __a = &local_9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(CurveType type) {
    switch (type) {
    case CurveType::Flat:
        return "Flat";
    case CurveType::Cylinder:
        return "Cylinder";
    case CurveType::Ribbon:
        return "Ribbon";
    default:
        LOG_FATAL("Unhandled case");
        return "";
    }
}